

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O1

int CVodeGetQuadDky(void *cvode_mem,sunrealtype t,int k,N_Vector dkyQ)

{
  double dVar1;
  double dVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  char *msgfmt;
  double dVar10;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar9 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    iVar6 = -0x15;
    iVar5 = 0xf23;
  }
  else if (*(int *)((long)cvode_mem + 0x5c) == 1) {
    if (dkyQ == (N_Vector)0x0) {
      msgfmt = "dky = NULL illegal.";
      iVar9 = -0x1a;
      iVar6 = -0x1a;
      iVar5 = 0xf34;
    }
    else if ((k < 0) || (uVar4 = *(uint *)((long)cvode_mem + 0x3c0), (int)uVar4 < k)) {
      msgfmt = "Illegal value for k.";
      iVar9 = -0x18;
      iVar6 = -0x18;
      iVar5 = 0xf3c;
    }
    else {
      dVar1 = *(double *)((long)cvode_mem + 0x408);
      dVar2 = *(double *)((long)cvode_mem + 0x810);
      dVar10 = (ABS(dVar2) + ABS(dVar1)) * *(double *)((long)cvode_mem + 8) * 100.0;
      dVar10 = (double)(-(ulong)(dVar2 < 0.0) & (ulong)-dVar10 |
                       ~-(ulong)(dVar2 < 0.0) & (ulong)dVar10);
      if ((t - (dVar10 + dVar1)) * (t - ((dVar1 - dVar2) - dVar10)) <= 0.0) {
        uVar7 = 0;
        iVar5 = uVar4 - k;
        if (k <= (int)uVar4) {
          dVar2 = *(double *)((long)cvode_mem + 0x3e0);
          uVar7 = 0;
          do {
            iVar6 = uVar4 - k;
            lVar3 = *(long *)((long)cvode_mem + 0xa50);
            *(undefined8 *)(lVar3 + uVar7 * 8) = 0x3ff0000000000000;
            if (k != 0) {
              dVar10 = *(double *)(lVar3 + uVar7 * 8);
              uVar8 = uVar4;
              do {
                dVar10 = dVar10 * (double)(int)uVar8;
                uVar8 = uVar8 - 1;
              } while (iVar6 < (int)uVar8);
              *(double *)(lVar3 + uVar7 * 8) = dVar10;
            }
            if (0 < iVar6) {
              dVar10 = *(double *)(lVar3 + uVar7 * 8);
              iVar9 = 0;
              do {
                dVar10 = dVar10 * ((t - dVar1) / dVar2);
                iVar9 = iVar9 + 1;
              } while (iVar9 < iVar6);
              *(double *)(lVar3 + uVar7 * 8) = dVar10;
            }
            *(undefined8 *)(*(long *)((long)cvode_mem + 0xa58) + uVar7 * 8) =
                 *(undefined8 *)((long)cvode_mem + (ulong)uVar4 * 8 + 0x200);
            uVar7 = uVar7 + 1;
            uVar4 = uVar4 - 1;
          } while (uVar7 != iVar5 + 1);
        }
        iVar5 = N_VLinearCombination
                          (uVar7,*(undefined8 *)((long)cvode_mem + 0xa50),
                           *(undefined8 *)((long)cvode_mem + 0xa58),dkyQ);
        if (iVar5 != 0) {
          return -0x1c;
        }
        if (k == 0) {
          return 0;
        }
        SUNRpowerI(*(undefined8 *)((long)cvode_mem + 0x3e0),-k);
        N_VScale(dkyQ,dkyQ);
        return 0;
      }
      msgfmt = "Illegal value for t.t = %lg is not between tcur - hu = %lg and tcur = %lg.";
      iVar9 = -0x19;
      iVar6 = -0x19;
      iVar5 = 0xf49;
    }
  }
  else {
    msgfmt = "Quadrature integration not activated.";
    iVar9 = -0x1e;
    iVar6 = -0x1e;
    iVar5 = 0xf2c;
  }
  cvProcessError((CVodeMem)cvode_mem,iVar6,iVar5,"CVodeGetQuadDky",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                 ,msgfmt);
  return iVar9;
}

Assistant:

int CVodeGetQuadDky(void* cvode_mem, sunrealtype t, int k, N_Vector dkyQ)
{
  sunrealtype s, r;
  sunrealtype tfuzz, tp, tn1;
  int i, j, nvec, ier;
  CVodeMem cv_mem;

  /* Check all inputs for legality */

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(CV_PROFILER);

  if (cv_mem->cv_quadr != SUNTRUE)
  {
    cvProcessError(cv_mem, CV_NO_QUAD, __LINE__, __func__, __FILE__,
                   MSGCV_NO_QUAD);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_NO_QUAD);
  }

  if (dkyQ == NULL)
  {
    cvProcessError(cv_mem, CV_BAD_DKY, __LINE__, __func__, __FILE__,
                   MSGCV_NULL_DKY);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_BAD_DKY);
  }

  if ((k < 0) || (k > cv_mem->cv_q))
  {
    cvProcessError(cv_mem, CV_BAD_K, __LINE__, __func__, __FILE__, MSGCV_BAD_K);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_BAD_K);
  }

  /* Allow for some slack */
  tfuzz = FUZZ_FACTOR * cv_mem->cv_uround *
          (SUNRabs(cv_mem->cv_tn) + SUNRabs(cv_mem->cv_hu));
  if (cv_mem->cv_hu < ZERO) { tfuzz = -tfuzz; }
  tp  = cv_mem->cv_tn - cv_mem->cv_hu - tfuzz;
  tn1 = cv_mem->cv_tn + tfuzz;
  if ((t - tp) * (t - tn1) > ZERO)
  {
    cvProcessError(cv_mem, CV_BAD_T, __LINE__, __func__, __FILE__, MSGCV_BAD_T);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_BAD_T);
  }

  /* Sum the differentiated interpolating polynomial */
  nvec = 0;

  s = (t - cv_mem->cv_tn) / cv_mem->cv_h;
  for (j = cv_mem->cv_q; j >= k; j--)
  {
    cv_mem->cv_cvals[nvec] = ONE;
    for (i = j; i >= j - k + 1; i--) { cv_mem->cv_cvals[nvec] *= i; }
    for (i = 0; i < j - k; i++) { cv_mem->cv_cvals[nvec] *= s; }
    cv_mem->cv_Xvecs[nvec] = cv_mem->cv_znQ[j];
    nvec += 1;
  }
  ier = N_VLinearCombination(nvec, cv_mem->cv_cvals, cv_mem->cv_Xvecs, dkyQ);
  if (ier != CV_SUCCESS)
  {
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_VECTOROP_ERR);
  }

  if (k == 0)
  {
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_SUCCESS);
  }
  r = SUNRpowerI(cv_mem->cv_h, -k);
  N_VScale(r, dkyQ, dkyQ);

  SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
  return (CV_SUCCESS);
}